

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O2

Matrix<int,_4UL,_4UL> __thiscall
Matrix<int,6ul,6ul>::conv<3ul,3ul>(Matrix<int,6ul,6ul> *this,Matrix<int,_3UL,_3UL> *kernel)

{
  __uniq_ptr_impl<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_> _Var1;
  int iVar2;
  int *piVar3;
  Matrix<int,_3UL,_3UL> *in_RDX;
  int j;
  size_t lt_col;
  int i;
  size_t lt_row;
  Matrix<int,_4UL,_4UL> result;
  __uniq_ptr_impl<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_> local_40;
  __uniq_ptr_impl<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_> local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>.
  super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl =
       (tuple<std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>)
       (tuple<std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>)this;
  Matrix<int,_4UL,_4UL>::Matrix((Matrix<int,_4UL,_4UL> *)&local_40);
  for (lt_row = 0;
      _Var1._M_t.
      super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>.
      super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl =
           local_38._M_t.
           super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>
           .super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl, lt_row != 4;
      lt_row = lt_row + 1) {
    for (lt_col = 0; lt_col != 4; lt_col = lt_col + 1) {
      iVar2 = conv_op<3ul,3ul>((Matrix<int,6ul,6ul> *)kernel,in_RDX,lt_row,lt_col);
      piVar3 = Matrix<int,_4UL,_4UL>::at((Matrix<int,_4UL,_4UL> *)&local_40,lt_row,lt_col);
      *piVar3 = iVar2;
    }
  }
  *(tuple<std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_> *)
   local_38._M_t.
   super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>.
   super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl =
       local_40._M_t.
       super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>
       .super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl;
  local_40._M_t.
  super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>.
  super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl =
       (tuple<std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>)
       (_Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>)0x0;
  std::unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>::~unique_ptr
            ((unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_> *)
             &local_40);
  return (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)
         (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)
         _Var1._M_t.
         super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>
         .super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl;
}

Assistant:

auto conv(const Matrix<T, KRow, KCol> &kernel) {
    static_assert(Row >= KRow and Col >= KCol, "kernel size miss matched");
    constexpr size_t nr = Row - KRow + 1, nc = Col - KCol + 1;
    Matrix<T, nr, nc> result;
    for (auto i = 0; i < nr; ++i) {
      for (auto j = 0; j < nc; ++j) {
        result.at(i, j) = conv_op(kernel, i, j);
      }
    }
    return result;
  }